

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::
AddTestPattern(ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>
               *this,char *param_1,char *test_base_name,
              TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
              *meta_factory,CodeLocation *code_location)

{
  TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
  *pTVar1;
  pointer *ppsVar2;
  allocator_type *__a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string *this_00;
  ulong uVar4;
  pointer psVar5;
  allocator_type *paVar6;
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>
  *extraout_RDX;
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>
  *pPVar7;
  pointer psVar8;
  ulong uVar9;
  ulong uVar10;
  allocator<char> local_69;
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>
  *local_68;
  TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
  *local_60;
  _func_int **local_58;
  TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
  local_50;
  _func_int **pp_Stack_48;
  undefined4 local_40;
  allocator_type *local_38;
  
  local_68 = this;
  this_00 = (string *)operator_new(0x50);
  local_60 = &local_50;
  pTVar1 = meta_factory + 2;
  if ((TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
       *)meta_factory->_vptr_TestMetaFactoryBase == pTVar1) {
    local_50._vptr_TestMetaFactoryBase = pTVar1->_vptr_TestMetaFactoryBase;
    pp_Stack_48 = meta_factory[3]._vptr_TestMetaFactoryBase;
  }
  else {
    local_50._vptr_TestMetaFactoryBase = pTVar1->_vptr_TestMetaFactoryBase;
    local_60 = (TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
                *)meta_factory->_vptr_TestMetaFactoryBase;
  }
  local_58 = meta_factory[1]._vptr_TestMetaFactoryBase;
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)pTVar1;
  meta_factory[1]._vptr_TestMetaFactoryBase = (_func_int **)0x0;
  *(undefined1 *)&meta_factory[2]._vptr_TestMetaFactoryBase = 0;
  local_40 = *(undefined4 *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  std::__cxx11::string::string<std::allocator<char>>(this_00,param_1,&local_69);
  *(char **)(this_00 + 0x20) = test_base_name;
  *(string **)(this_00 + 0x28) = this_00 + 0x38;
  if (local_60 == &local_50) {
    *(_func_int ***)(this_00 + 0x38) = local_50._vptr_TestMetaFactoryBase;
    *(_func_int ***)(this_00 + 0x40) = pp_Stack_48;
  }
  else {
    *(TestMetaFactoryBase<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
      **)(this_00 + 0x28) = local_60;
    *(_func_int ***)(this_00 + 0x38) = local_50._vptr_TestMetaFactoryBase;
  }
  *(_func_int ***)(this_00 + 0x30) = local_58;
  local_58 = (_func_int **)0x0;
  local_50._vptr_TestMetaFactoryBase = local_50._vptr_TestMetaFactoryBase & 0xffffffffffffff00;
  *(undefined4 *)(this_00 + 0x48) = local_40;
  __a = (allocator_type *)
        (local_68->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = &local_50;
  if (__a == (allocator_type *)
             (local_68->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = (allocator_type *)
               (local_68->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__a - (long)local_38 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar9 = (long)__a - (long)local_38 >> 4;
    uVar4 = 1;
    if (__a != local_38) {
      uVar4 = uVar9;
    }
    uVar10 = uVar4 + uVar9;
    if (0x7fffffffffffffe < uVar10) {
      uVar10 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar4,uVar9)) {
      uVar10 = 0x7ffffffffffffff;
    }
    if (uVar10 == 0) {
      psVar5 = (pointer)0x0;
      pPVar7 = local_68;
    }
    else {
      psVar5 = (pointer)operator_new(uVar10 << 4);
      pPVar7 = extraout_RDX;
    }
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo*>
              ((allocator_type *)(psVar5 + uVar9),
               (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>
                *)this_00,(TestInfo **)pPVar7);
    pPVar7 = local_68;
    psVar8 = psVar5;
    for (paVar6 = local_38; __a != paVar6; paVar6 = paVar6 + 0x10) {
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(paVar6 + 8);
      *(undefined8 *)(paVar6 + 8) = 0;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = *(element_type **)paVar6;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var3;
      *(undefined8 *)paVar6 = 0;
      psVar8 = psVar8 + 1;
    }
    if (local_38 != (allocator_type *)0x0) {
      operator_delete(local_38,(long)(local_68->tests_).
                                     super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_38);
    }
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar5;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar8 + 1;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar5 + uVar10;
  }
  else {
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo*>
              (__a,(shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>
                    *)this_00,(TestInfo **)local_68);
    ppsVar2 = &(local_68->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed64CasesWithSizes>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppsVar2 = *ppsVar2 + 1;
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,(long)local_50._vptr_TestMetaFactoryBase + 1);
  }
  return;
}

Assistant:

void AddTestPattern(const char*,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }